

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::XFBVariableStrideTest::testInit(XFBVariableStrideTest *this)

{
  pointer *pptVar1;
  iterator __position;
  GLuint i;
  GLuint index;
  XFBVariableStrideTest *this_00;
  GLuint stage;
  STAGES SVar2;
  Type TVar3;
  testCase local_44;
  
  index = 0;
  this_00 = this;
  do {
    TVar3 = TestBase::getType((TestBase *)this_00,index);
    SVar2 = COMPUTE;
    do {
      if (SVar2 != FRAGMENT && (SVar2 & FRAGMENT) != COMPUTE) {
        local_44.m_case = VALID;
        __position._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_44.m_stage = SVar2;
        local_44.m_type = TVar3;
        if (__position._M_current ==
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          this_00 = (XFBVariableStrideTest *)&this->m_test_cases;
          std::
          vector<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase,std::allocator<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase>>
          ::_M_realloc_insert<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase_const&>
                    ((vector<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase,std::allocator<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase>>
                      *)&this->m_test_cases,__position,&local_44);
        }
        else {
          local_44.m_type.m_n_rows = TVar3.m_n_rows;
          ((__position._M_current)->m_type).m_n_rows = local_44.m_type.m_n_rows;
          local_44.m_type._0_8_ = TVar3._0_8_;
          (__position._M_current)->m_case = (int)((ulong)SVar2 << 0x20);
          (__position._M_current)->m_stage = (int)(((ulong)SVar2 << 0x20) >> 0x20);
          ((__position._M_current)->m_type).m_basic_type = local_44.m_type.m_basic_type;
          ((__position._M_current)->m_type).m_n_columns = local_44.m_type.m_n_columns;
          pptVar1 = &(this->m_test_cases).
                     super__Vector_base<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
      }
      SVar2 = SVar2 + VERTEX;
    } while (SVar2 != STAGE_MAX);
    index = index + 1;
  } while (index != 0x22);
  return;
}

Assistant:

void XFBVariableStrideTest::testInit()
{
	const GLuint n_types = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type = getType(i);

		/*
		 Some of the cases are declared as following are considered as invalid,
		 but accoring to spec, the following declaration is valid: shaders in the
		 transform feedback capturing mode have an initial global default of layout(xfb_buffer=0) out,
		 so for the first variable's declaration, the xfb_stride = 16 is applied on buffer 0,  for the
		 second variable, its buffer is also inherited from global buffer 0, and its offset does not overflows
		 the stride.

		 The xfb_stride is the memory width of given buffer, not for variable even though xfb_stride
		 is declared on the variable. It seems that the writter of this case misunderstand the concept of
		 xfb_stride, because spec describes that xfb_stride can be declared multiple times for the same buffer,
		 it is a compile or link-time error to have different values specified for the stride for the same buffer.

		 int type_size = 8;
		 layout (xfb_offset = 0, xfb_stride = 2 * type_size) out double goku;
		 layout (xfb_offset = type_size)                     out double vegeta;
		 */
		// all the shaders are valid, so remove the following loop(it contains CASE_MAX is enum of valid and invalid)
		// for (GLuint c = 0; c < CASE_MAX; ++c)
		{
			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				if ((Utils::Shader::COMPUTE == stage) || (Utils::Shader::TESS_CTRL == stage) ||
					(Utils::Shader::FRAGMENT == stage))
				{
					continue;
				}

				testCase test_case = { (CASES)VALID, (Utils::Shader::STAGES)stage, type };

				m_test_cases.push_back(test_case);
			}
		}
	}
}